

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall
pstore::file::in_memory::write_buffer(in_memory *this,not_null<const_void_*> ptr,size_t nbytes)

{
  element_type *ptr_00;
  uchar *ptr_01;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_98;
  span<unsigned_char,__1L> local_88;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_78;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_68;
  undefined1 local_58 [8];
  span<const_unsigned_char,__1L> src_span;
  span<unsigned_char,__1L> dest_span;
  long max;
  size_t nbytes_local;
  in_memory *this_local;
  not_null<const_void_*> ptr_local;
  
  this_local = (in_memory *)ptr.ptr_;
  check_writable(this);
  if (this->length_ <= this->pos_) {
    assert_failed("length_ > pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                  ,0xd5);
  }
  if (this->length_ - this->pos_ < nbytes) {
    raise<std::errc>(invalid_argument);
  }
  if (((this->length_ < 0x8000000000000000) && (this->pos_ < 0x8000000000000000)) &&
     (nbytes < 0x8000000000000000)) {
    ptr_00 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(this->buffer_).
                         super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
    join_0x00000010_0x00000000_ =
         (storage_type<pstore::gsl::details::extent_type<_1L>_>)
         gsl::make_span<unsigned_char>(ptr_00,this->length_);
    gsl::span<unsigned_char,_-1L>::subspan
              ((span<unsigned_char,__1L> *)&src_span.storage_.data_,this->pos_,nbytes);
    ptr_01 = (uchar *)gsl::not_null<const_void_*>::get((not_null<const_void_*> *)&this_local);
    _local_58 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                gsl::make_span<unsigned_char_const>(ptr_01,nbytes);
    std::begin<pstore::gsl::span<unsigned_char_const,_1l>>
              ((span<const_unsigned_char,__1L> *)&local_68);
    std::end<pstore::gsl::span<unsigned_char_const,_1l>>
              ((span<const_unsigned_char,__1L> *)&local_78);
    std::begin<pstore::gsl::span<unsigned_char,_1l>>(&local_88);
    std::
    copy<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char_const,_1l>,false>,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>
              (&local_98,&local_68,&local_78);
    if (this->pos_ <= this->pos_ + nbytes) {
      this->pos_ = nbytes + this->pos_;
      if (this->eof_ < this->pos_) {
        this->eof_ = this->pos_;
      }
      return;
    }
    assert_failed("pos_ + nbytes >= pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                  ,0xee);
  }
  assert_failed("length_ <= max && pos_ <= max && nbytes <= max",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                ,0xe1);
}

Assistant:

void in_memory::write_buffer (gsl::not_null<void const *> const ptr,
                                      std::size_t const nbytes) {
            this->check_writable ();
            PSTORE_ASSERT (length_ > pos_);
            if (nbytes > length_ - pos_) {
                raise (std::errc::invalid_argument);
            }

            using element_type = decltype (buffer_)::element_type;
            using index_type = gsl::span<element_type>::index_type;
#ifndef NDEBUG
            {
                // TODO: if nbytes > index_type max if would be much better to split the
                // write into two pieces rather than just fail...
                constexpr auto max = std::numeric_limits<index_type>::max ();
                PSTORE_ASSERT (length_ <= max && pos_ <= max && nbytes <= max);
            }
#endif
            auto dest_span =
                gsl::make_span (buffer_.get (), static_cast<index_type> (length_))
                    .subspan (static_cast<index_type> (pos_), static_cast<index_type> (nbytes));
            auto src_span = gsl::make_span (static_cast<element_type const *> (ptr.get ()),
                                            static_cast<index_type> (nbytes));

            static_assert (std::is_same<decltype (src_span)::index_type, index_type>::value,
                           "expected index_type of src_span and dest_span to be the same");

            std::copy (std::begin (src_span), std::end (src_span), std::begin (dest_span));
            PSTORE_ASSERT (pos_ + nbytes >= pos_);
            pos_ += nbytes;
            if (pos_ > eof_) {
                eof_ = pos_;
            }
        }